

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O1

void __thiscall
lr_grammar::GrammarLR::calculate_expression_first
          (GrammarLR *this,int elemIndex,int expressionIndex,
          vector<int,_std::allocator<int>_> *result,bool choose)

{
  pointer piVar1;
  pointer pEVar2;
  pointer pvVar3;
  iterator iVar4;
  bool bVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  Express *this_00;
  undefined3 in_register_00000081;
  int index;
  ulong uVar12;
  vector<int,_std::allocator<int>_> notNULL;
  vector<int,_std::allocator<int>_> tmpF;
  int local_74;
  undefined4 local_70;
  int local_6c;
  vector<int,_std::allocator<int>_> local_68;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_70 = CONCAT31(in_register_00000081,choose);
  piVar1 = (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  lVar6 = (long)elemIndex;
  lVar8 = (long)expressionIndex;
  lVar9 = *(long *)&(this->elements).
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar6].expression_of_set.
                    super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                    ._M_impl.super__Vector_impl_data;
  if (*(long *)(lVar9 + 8 + lVar8 * 0x18) != *(long *)(lVar9 + lVar8 * 0x18)) {
    this_00 = (Express *)(lVar9 + lVar8 * 0x18);
    uVar12 = 0;
    local_50 = lVar6 * 0x18;
    local_74 = expressionIndex;
    local_6c = elemIndex;
    do {
      index = (int)uVar12;
      piVar7 = base_grammar::Express::operator[](this_00,index);
      if (*piVar7 == elemIndex) {
        bVar5 = public_tool::is_in_vector
                          ((vector<int,_std::allocator<int>_> *)
                           ((long)&(((this->first).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_50),-1);
        if (!bVar5) {
          if ((char)local_70 == '\0') {
            return;
          }
          iVar4._M_current =
               (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current !=
              (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar4._M_current = local_74;
            (this->first_temp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar4._M_current + 1;
            return;
          }
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->first_temp,iVar4,&local_74);
          return;
        }
      }
      else {
        piVar7 = base_grammar::Express::operator[]
                           ((Express *)
                            ((long)local_74 * 0x18 +
                            *(long *)&(this->elements).
                                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                      expression_of_set.
                                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                      ._M_impl.super__Vector_impl_data),index);
        bVar5 = get_first(this,*piVar7);
        if (!bVar5) {
          bVar5 = public_tool::is_in_vector(result,-1);
          if (bVar5) {
            return;
          }
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(local_68.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
          iVar4._M_current =
               (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar4._M_current !=
              (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar4._M_current = -1;
            (result->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar4._M_current + 1;
            return;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (result,iVar4,(int *)&local_68);
          return;
        }
        pEVar2 = (this->elements).
                 super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = (long)local_74;
        lVar9 = *(long *)&pEVar2[lVar6].expression_of_set.
                          super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                          ._M_impl.super__Vector_impl_data;
        if ((*(long *)(lVar9 + 8 + lVar8 * 0x18) - *(long *)(lVar9 + lVar8 * 0x18) >> 2) - 1U ==
            uVar12) {
          piVar7 = base_grammar::Express::operator[]((Express *)(lVar9 + lVar8 * 0x18),index);
          public_tool::connect_vector
                    (result,(this->first).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + *piVar7);
        }
        else {
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          piVar7 = base_grammar::Express::operator[]
                             ((Express *)
                              (lVar8 * 0x18 +
                              *(long *)&pEVar2[lVar6].expression_of_set.
                                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                        ._M_impl.super__Vector_impl_data),index);
          pvVar3 = (this->first).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar1 = *(pointer *)
                    ((long)&pvVar3[*piVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          lVar9 = *(long *)&pvVar3[*piVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
          piVar7 = base_grammar::Express::operator[]
                             ((Express *)
                              ((long)local_74 * 0x18 +
                              *(long *)&(this->elements).
                                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                        expression_of_set.
                                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                        ._M_impl.super__Vector_impl_data),index);
          std::vector<int,_std::allocator<int>_>::vector
                    (&local_48,
                     (this->first).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + *piVar7);
          uVar10 = (uint)((ulong)((long)piVar1 - lVar9) >> 2);
          if (0 < (int)uVar10) {
            uVar11 = (ulong)(uVar10 & 0x7fffffff);
            lVar9 = 0;
            do {
              if (*(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar9) != -1) {
                if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_68,
                             (iterator)
                             local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,
                             (int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start + lVar9));
                }
                else {
                  *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish =
                       *(int *)((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start + lVar9);
                  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
              }
              lVar9 = lVar9 + 4;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          public_tool::connect_vector(result,&local_68);
          elemIndex = local_6c;
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        piVar7 = base_grammar::Express::operator[]
                           ((Express *)
                            ((long)local_74 * 0x18 +
                            *(long *)&(this->elements).
                                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                      expression_of_set.
                                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                      ._M_impl.super__Vector_impl_data),index);
        bVar5 = public_tool::is_in_vector
                          ((this->first).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *piVar7,-1);
        if (!bVar5) {
          return;
        }
      }
      uVar12 = uVar12 + 1;
      this_00 = (Express *)
                (*(long *)&(this->elements).
                           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar6].expression_of_set.
                           super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                           ._M_impl.super__Vector_impl_data + (long)local_74 * 0x18);
    } while (uVar12 < (ulong)((long)(this_00->expression).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)(this_00->expression).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void  GrammarLR::calculate_expression_first(int elemIndex, int expressionIndex, vector<int>& result, bool choose){

    result.clear();
    //vector<int>::iterator it =elements[elemIndex].expression_of_set[expressionIndex].expression.begin() ;
    //vector<int>::iterator end = elements[elemIndex].expression_of_set[expressionIndex].expression.end();




    for (int i = 0; i < elements[elemIndex].expression_of_set[expressionIndex].expression.size(); i++){

        //对于这种情况有没有可能出现：
        //A->TAb|c|T
        //T->@|t
        //进行递归了
        if (elements[elemIndex].expression_of_set[expressionIndex][i] == elemIndex) {

            //后续处理
            if (public_tool::is_in_vector(first[elemIndex], -1)) continue;
            else{
                if (choose) this->first_temp.push_back(expressionIndex);
                break;
            }

        }

        if (get_first(elements[elemIndex].expression_of_set[expressionIndex][i])){

            if (i == elements[elemIndex].expression_of_set[expressionIndex].expression.size() - 1){
                public_tool::connect_vector(result, first[elements[elemIndex].expression_of_set[expressionIndex][i]]);
            }
            else
            {
                vector<int> notNULL;//将空串除去
                int length = first[elements[elemIndex].expression_of_set[expressionIndex][i]].size();
                vector<int> tmpF = first[elements[elemIndex].expression_of_set[expressionIndex][i]];
                for (int j = 0; j < length; j++){
                    if (tmpF[j] != -1){
                        notNULL.push_back(tmpF[j]);
                    }
                }
                public_tool::connect_vector(result, notNULL);
            }

        }
        else
        {
            if (!public_tool::is_in_vector(result, -1)) result.push_back(-1);
            break;
        }

        //-1不在这个式子里面后面不用继续了
        if (!public_tool::is_in_vector(first[elements[elemIndex].expression_of_set[expressionIndex][i]], -1)) break;

    }
}